

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modulator.cpp
# Opt level: O0

EffectState * __thiscall
anon_unknown.dwarf_14a0f7::ModulatorStateFactory::create(ModulatorStateFactory *this)

{
  EffectState *__s;
  ModulatorState *unaff_retaddr;
  size_t in_stack_fffffffffffffff0;
  
  __s = (EffectState *)
        (anonymous_namespace)::ModulatorState::operator_new(in_stack_fffffffffffffff0);
  memset(__s,0,0x9f0);
  ModulatorState::ModulatorState(unaff_retaddr);
  return __s;
}

Assistant:

EffectState *create() override { return new ModulatorState{}; }